

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

int QMetaObject::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  socklen_t __len_00;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  int in_register_0000003c;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QMetaObject *smeta;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __len_00 = (*(code *)**(undefined8 **)__addr)();
  uVar2 = methodIndexToSignalIndex((QMetaObject **)CONCAT44(in_R8D,in_R9D),in_register_0000003c);
  iVar3 = QMetaObjectPrivate::connect((int)__addr,(sockaddr *)(ulong)uVar2,__len_00);
  Connection::Connection
            ((Connection *)CONCAT44(in_register_0000003c,__fd),(void *)CONCAT44(extraout_var,iVar3))
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __fd;
  }
  __stack_chk_fail();
}

Assistant:

QMetaObject::Connection QMetaObject::connect(const QObject *sender, int signal_index,
                                             const QObject *receiver, int method_index, int type,
                                             int *types)
{
    const QMetaObject *smeta = sender->metaObject();
    signal_index = methodIndexToSignalIndex(&smeta, signal_index);
    return Connection(QMetaObjectPrivate::connect(sender, signal_index, smeta,
                                       receiver, method_index,
                                       nullptr, //FIXME, we could speed this connection up by computing the relative index
                                       type, types));
}